

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void __thiscall ObjectBlockPool<8,_8192>::Mark(ObjectBlockPool<8,_8192> *this,uint number)

{
  MyLargeBlock *pMVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (number < 2) {
    pMVar1 = this->activePages;
    if (pMVar1 != (MyLargeBlock *)0x0) {
      do {
        if ((pMVar1 != this->activePages) || (this->lastNum != 0)) {
          uVar2 = 0;
          do {
            pMVar1->page[uVar2].marker =
                 pMVar1->page[uVar2].marker & 0xfffffffffffffffe | (ulong)number;
            uVar2 = uVar2 + 1;
            uVar3 = (ulong)this->lastNum;
            if (pMVar1 != this->activePages) {
              uVar3 = 0x2000;
            }
          } while (uVar2 < uVar3);
        }
        pMVar1 = pMVar1->next;
      } while (pMVar1 != (LargeBlock<8,_8192> *)0x0);
    }
    return;
  }
  __assert_fail("number <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StdLib.cpp"
                ,0xe6,
                "void ObjectBlockPool<8, 8192>::Mark(unsigned int) [elemSize = 8, countInBlock = 8192]"
               );
}

Assistant:

void Mark(unsigned int number)
	{
		assert(number <= 1);
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				curr->page[i].marker = (curr->page[i].marker & ~NULLC::OBJECT_VISIBLE) | number;
			}
			curr = curr->next;
		}
	}